

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::AssertionHandler::handleExpr<unsigned_long_const&>
          (AssertionHandler *this,ExprLhs<const_unsigned_long_&> *expr)

{
  (*this->m_resultCapture->_vptr_IResultCapture[10])();
  return;
}

Assistant:

void handleExpr( ExprLhs<T> const& expr ) {
            handleExpr( expr.makeUnaryExpr() );
        }